

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags_storage.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tfl::detail::flags_storage<8ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,void *this,char zero,char one)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_50._M_p = &local_40;
  local_48 = 0;
  local_40 = '\0';
  std::__cxx11::string::reserve((ulong)&local_50);
  for (lVar1 = 7; lVar1 != -1; lVar1 = lVar1 + -1) {
    std::__cxx11::string::push_back((char)&local_50);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_50._M_p == &local_40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  __return_storage_ptr__->_M_string_length = local_48;
  return __return_storage_ptr__;
}

Assistant:

auto to_string(CharT zero = CharT('0'), CharT one = CharT('1')) const
    {
        std::basic_string<CharT, Traits, Allocator> res;
        res.reserve(N);
        for (size_t i = N; i > 0;)
            res += get_bit(--i) ? one : zero;
        return res;
    }